

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O0

void __thiscall pm::Sampler::mapSamplesToHemisphere(Sampler *this,float e)

{
  size_type sVar1;
  reference pvVar2;
  Vector3 local_40;
  float local_34;
  float local_30;
  float sinTheta;
  float cosTheta;
  float sinPhi;
  float cosPhi;
  uint i;
  size_t size;
  Sampler *pSStack_10;
  float e_local;
  Sampler *this_local;
  
  size._4_4_ = e;
  pSStack_10 = this;
  _cosPhi = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::size(&this->samples_);
  sVar1 = std::vector<pm::Vector3,_std::allocator<pm::Vector3>_>::size(&this->hemisphereSamples_);
  if (sVar1 != _cosPhi) {
    std::vector<pm::Vector3,_std::allocator<pm::Vector3>_>::clear(&this->hemisphereSamples_);
    std::vector<pm::Vector3,_std::allocator<pm::Vector3>_>::reserve
              (&this->hemisphereSamples_,_cosPhi);
    for (sinPhi = 0.0; (uint)sinPhi < _cosPhi; sinPhi = (float)((int)sinPhi + 1)) {
      pvVar2 = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                         (&this->samples_,(ulong)(uint)sinPhi);
      cosTheta = cosf(pvVar2->x * 6.2831855);
      pvVar2 = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                         (&this->samples_,(ulong)(uint)sinPhi);
      sinTheta = sinf(pvVar2->x * 6.2831855);
      pvVar2 = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                         (&this->samples_,(ulong)(uint)sinPhi);
      local_30 = powf(1.0 - pvVar2->y,1.0 / (size._4_4_ + 1.0));
      local_34 = sqrtf(-local_30 * local_30 + 1.0);
      Vector3::Vector3(&local_40,local_34 * cosTheta,local_34 * sinTheta,local_30);
      std::vector<pm::Vector3,_std::allocator<pm::Vector3>_>::push_back
                (&this->hemisphereSamples_,&local_40);
    }
  }
  return;
}

Assistant:

void Sampler::mapSamplesToHemisphere(float e)
{
	const size_t size = samples_.size();
	if (hemisphereSamples_.size() == size)
		return;

	hemisphereSamples_.clear();
	hemisphereSamples_.reserve(size);

	for (unsigned int i = 0; i < size; i++)
	{
		const float cosPhi = cosf(2.0f * pi * samples_[i].x);
		const float sinPhi = sinf(2.0f * pi * samples_[i].x);
		const float cosTheta = powf((1.0f - samples_[i].y), 1.0f / (e + 1.0f));
		const float sinTheta = sqrtf(1.0f - cosTheta * cosTheta);

		hemisphereSamples_.push_back(Vector3(sinTheta * cosPhi, sinTheta * sinPhi, cosTheta));
	}
}